

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

bool __thiscall libebml::EbmlMaster::VerifyChecksum(EbmlMaster *this)

{
  int iVar1;
  uint32 uVar2;
  uint32 uVar3;
  undefined4 extraout_var;
  size_type sVar4;
  const_reference ppEVar5;
  binary *s;
  uint64 uVar6;
  ulong local_c8;
  size_t Index;
  undefined1 local_b0 [8];
  MemIOCallback TmpBuf;
  EbmlCrc32 aChecksum;
  EbmlMaster *this_local;
  
  if ((this->bChecksumUsed & 1U) == 0) {
    this_local._7_1_ = true;
  }
  else {
    EbmlCrc32::EbmlCrc32((EbmlCrc32 *)&TmpBuf.dataBufferMemorySize);
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    MemIOCallback::MemIOCallback((MemIOCallback *)local_b0,CONCAT44(extraout_var,iVar1) - 6);
    local_c8 = 0;
    while( true ) {
      sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                        (&this->ElementList);
      if (sVar4 <= local_c8) break;
      ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                operator[](&this->ElementList,local_c8);
      EbmlElement::Render(*ppEVar5,(IOCallback *)local_b0,true,false,true);
      local_c8 = local_c8 + 1;
    }
    s = MemIOCallback::GetDataBuffer((MemIOCallback *)local_b0);
    uVar6 = MemIOCallback::GetDataBufferSize((MemIOCallback *)local_b0);
    EbmlCrc32::FillCRC32((EbmlCrc32 *)&TmpBuf.dataBufferMemorySize,s,(uint32)uVar6);
    uVar2 = EbmlCrc32::GetCrc32((EbmlCrc32 *)&TmpBuf.dataBufferMemorySize);
    uVar3 = EbmlCrc32::GetCrc32(&this->Checksum);
    this_local._7_1_ = uVar2 == uVar3;
    MemIOCallback::~MemIOCallback((MemIOCallback *)local_b0);
    EbmlCrc32::~EbmlCrc32((EbmlCrc32 *)&TmpBuf.dataBufferMemorySize);
  }
  return this_local._7_1_;
}

Assistant:

bool EbmlMaster::VerifyChecksum() const
{
  if (!bChecksumUsed)
    return true;

  EbmlCrc32 aChecksum;
  /// \todo remove the Checksum if it's in the list
  /// \todo find another way when not all default values are saved or (unknown from the reader !!!)
  MemIOCallback TmpBuf(GetSize() - 6);
  for (size_t Index = 0; Index < ElementList.size(); Index++) {
    (ElementList[Index])->Render(TmpBuf, true, false, true);
  }
  aChecksum.FillCRC32(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
  return (aChecksum.GetCrc32() == Checksum.GetCrc32());
}